

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

bool __thiscall
dtc::fdt::checking::anon_unknown_4::address_cells_checker::check_node
          (address_cells_checker *this,device_tree *param_1,node_ptr *n)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  string *psVar5;
  bool local_59;
  __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
  local_50;
  iterator e;
  iterator i;
  bool found_size;
  child_iterator cStack_38;
  bool found_address;
  __normal_iterator<std::shared_ptr<dtc::fdt::node>_*,_std::vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>_>
  local_30;
  __shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_28;
  node_ptr *n_local;
  device_tree *param_1_local;
  address_cells_checker *this_local;
  
  local_28 = (__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)n;
  n_local = (node_ptr *)param_1;
  param_1_local = (device_tree *)this;
  peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)n);
  local_30._M_current = (shared_ptr<dtc::fdt::node> *)node::child_begin(peVar2);
  peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_28);
  cStack_38 = node::child_end(peVar2);
  bVar1 = __gnu_cxx::operator==(&local_30,&stack0xffffffffffffffc8);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    i._M_current._7_1_ = false;
    i._M_current._6_1_ = false;
    peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    e = node::property_begin(peVar2);
    peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_28);
    local_50._M_current = (shared_ptr<dtc::fdt::property> *)node::property_end(peVar2);
    while (bVar1 = __gnu_cxx::operator!=(&e,&local_50), bVar1) {
      if (i._M_current._7_1_ == false) {
        p_Var3 = (__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
                    ::operator*(&e);
        peVar4 = std::
                 __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        psVar5 = property::get_key_abi_cxx11_(peVar4);
        i._M_current._7_1_ = std::operator==(psVar5,"#address-cells");
      }
      if (i._M_current._6_1_ == false) {
        p_Var3 = (__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
                    ::operator*(&e);
        peVar4 = std::
                 __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        psVar5 = property::get_key_abi_cxx11_(peVar4);
        i._M_current._6_1_ = std::operator==(psVar5,"#size-cells");
      }
      if ((i._M_current._6_1_ != false) && (i._M_current._7_1_ != false)) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<dtc::fdt::property>_*,_std::vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>_>
      ::operator++(&e);
    }
    if (i._M_current._7_1_ == false) {
      checker::report_error(&this->super_checker,"Missing #address-cells property");
    }
    if (i._M_current._6_1_ == false) {
      checker::report_error(&this->super_checker,"Missing #size-cells property");
    }
    local_59 = false;
    if (i._M_current._7_1_ != false) {
      local_59 = i._M_current._6_1_;
    }
    this_local._7_1_ = local_59;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool check_node(device_tree *, const node_ptr &n)
		{
			// If this has no children, it trivially meets the
			// conditions.
			if (n->child_begin() == n->child_end())
			{
				return true;
			}
			bool found_address = false;
			bool found_size = false;
			for (auto i=n->property_begin(), e=n->property_end() ; i!=e ; ++i)
			{
				if (!found_address)
				{
					found_address = ((*i)->get_key() == "#address-cells");
				}
				if (!found_size)
				{
					found_size = ((*i)->get_key() == "#size-cells");
				}
				if (found_size && found_address)
				{
						break;
				}
			}
			if (!found_address)
			{
					report_error("Missing #address-cells property");
			}
			if (!found_size)
			{
					report_error("Missing #size-cells property");
			}
			return found_address && found_size;
		}